

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

int64_t compute_sse_plane(MACROBLOCK *x,MACROBLOCKD *xd,int plane,BLOCK_SIZE bsize)

{
  int64_t iVar1;
  BLOCK_SIZE in_CL;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  int64_t sse;
  macroblock_plane *p;
  int bh;
  int bw;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  undefined1 *puVar2;
  macroblockd_plane *pd_00;
  undefined7 in_stack_ffffffffffffffb8;
  BLOCK_SIZE in_stack_ffffffffffffffbf;
  MACROBLOCKD *in_stack_ffffffffffffffc0;
  MACROBLOCKD *in_stack_ffffffffffffffd0;
  BLOCK_SIZE local_21;
  int *width;
  undefined3 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe8);
  width = in_RSI + (long)in_EDX * 0x28c + 4;
  local_21 = get_plane_block_size(in_CL,width[1],width[2]);
  puVar2 = &stack0xffffffffffffffd8;
  pd_00 = (macroblockd_plane *)&stack0xffffffffffffffd4;
  get_txb_dimensions(in_stack_ffffffffffffffd0,(int)((ulong)(in_RDI + (long)in_EDX * 0x22) >> 0x20),
                     (BLOCK_SIZE)((ulong)(in_RDI + (long)in_EDX * 0x22) >> 0x18),
                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbf,width,(int *)CONCAT44(in_EDX,uVar3),in_RSI,in_RDI);
  iVar1 = calculate_sse(in_stack_ffffffffffffffc0,
                        (macroblock_plane *)
                        CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),pd_00,
                        (int)((ulong)puVar2 >> 0x20),(int)puVar2);
  return iVar1;
}

Assistant:

static inline int64_t compute_sse_plane(MACROBLOCK *x, MACROBLOCKD *xd,
                                        int plane, const BLOCK_SIZE bsize) {
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
  int bw, bh;
  const struct macroblock_plane *const p = &x->plane[plane];
  get_txb_dimensions(xd, plane, plane_bsize, 0, 0, plane_bsize, NULL, NULL, &bw,
                     &bh);

  int64_t sse = calculate_sse(xd, p, pd, bw, bh);

  return sse;
}